

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O3

void Sle_ManPrintCuts(Gia_Man_t *p,Vec_Int_t *vCuts,int iObj)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  
  if ((iObj < 0) || (vCuts->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar1 = vCuts->pArray;
  lVar4 = (long)piVar1[(uint)iObj];
  if ((-1 < lVar4) && ((uint)piVar1[(uint)iObj] < (uint)vCuts->nSize)) {
    iVar3 = 0;
    printf("Obj %3d\n",(ulong)(uint)iObj);
    if (0 < piVar1[lVar4]) {
      puVar2 = (uint *)(piVar1 + lVar4);
      do {
        puVar2 = puVar2 + 1;
        Sle_ManPrintCut((int *)puVar2);
        iVar3 = iVar3 + 1;
        puVar2 = puVar2 + (*puVar2 & 0xf);
      } while (iVar3 < piVar1[lVar4]);
    }
    putchar(10);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

void Sle_ManPrintCuts( Gia_Man_t * p, Vec_Int_t * vCuts, int iObj )
{
    int i, * pCut;
    int * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    printf( "Obj %3d\n", iObj );
    Sle_ForEachCut( pList, pCut, i )
        Sle_ManPrintCut( pCut );
    printf( "\n" );
}